

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

void Bac_ManCollectGateNameOne
               (Mio_Library_t *pLib,Ptr_ObjType_t Type,word Truth,Vec_Ptr_t *vGateNames)

{
  Mio_Gate_t *pGate_00;
  char *Entry;
  Mio_Gate_t *pGate;
  Vec_Ptr_t *vGateNames_local;
  word Truth_local;
  Ptr_ObjType_t Type_local;
  Mio_Library_t *pLib_local;
  
  pGate_00 = Mio_LibraryReadGateByTruth(pLib,Truth);
  if (pGate_00 != (Mio_Gate_t *)0x0) {
    Entry = Mio_GateReadName(pGate_00);
    Vec_PtrWriteEntry(vGateNames,Type,Entry);
  }
  return;
}

Assistant:

void Bac_ManCollectGateNameOne( Mio_Library_t * pLib, Ptr_ObjType_t Type, word Truth, Vec_Ptr_t * vGateNames )
{
    Mio_Gate_t * pGate = Mio_LibraryReadGateByTruth( pLib, Truth );
    if ( pGate != NULL )
        Vec_PtrWriteEntry( vGateNames, Type, Mio_GateReadName(pGate) );
}